

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  
  pIVar2 = GImGui;
  if (((GImGui->CurrentWindowStack).Size < 2) && (GImGui->FrameScopePushedImplicitWindow != false))
  {
    return;
  }
  pIVar5 = GImGui->CurrentWindow;
  if ((pIVar5->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    EndColumns();
  }
  PopClipRect();
  uVar3 = pIVar5->Flags;
  if ((uVar3 >> 0x18 & 1) == 0) {
    LogFinish();
    uVar3 = pIVar5->Flags;
  }
  iVar1 = (pIVar2->CurrentWindowStack).Size;
  iVar4 = iVar1 + -1;
  (pIVar2->CurrentWindowStack).Size = iVar4;
  if ((uVar3 >> 0x1a & 1) != 0) {
    (pIVar2->BeginPopupStack).Size = (pIVar2->BeginPopupStack).Size + -1;
  }
  if (iVar4 == 0) {
    pIVar5 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar5 = (pIVar2->CurrentWindowStack).Data[(long)iVar1 + -2];
  }
  SetCurrentWindow(pIVar5);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}